

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-death-test.cc
# Opt level: O1

void __thiscall testing::internal::DeathTestImpl::ReadAndInterpretStatusByte(DeathTestImpl *this)

{
  bool bVar1;
  int iVar2;
  ssize_t sVar3;
  int *piVar4;
  long *plVar5;
  ostream *poVar6;
  size_t sVar7;
  long *plVar8;
  size_type *psVar9;
  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar10;
  uint uVar11;
  undefined1 local_228 [8];
  char buffer [256];
  string local_120;
  undefined1 *local_100 [2];
  undefined1 local_f0 [16];
  long *local_e0;
  long local_d8;
  long local_d0;
  long lStack_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  int local_9c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_78;
  Message error;
  long local_68;
  long lStack_60;
  string local_58;
  byte local_31 [8];
  char flag;
  
  do {
    sVar3 = read(this->read_fd_,local_31,1);
    iVar2 = (int)sVar3;
    if (iVar2 != -1) {
      if (iVar2 == 0) {
        this->outcome_ = DIED;
        goto LAB_0012e87e;
      }
      if (iVar2 == 1) {
        if (local_31[0] < 0x52) {
          if (local_31[0] == 0x49) {
            iVar2 = this->read_fd_;
            Message::Message((Message *)&local_78);
            do {
              while( true ) {
                sVar3 = read(iVar2,local_228,0xff);
                uVar11 = (uint)sVar3;
                if ((int)uVar11 < 1) break;
                buffer[(ulong)(uVar11 & 0x7fffffff) - 8] = '\0';
                poVar6 = (ostream *)(local_78._M_head_impl + 0x10);
                sVar7 = strlen(local_228);
                std::__ostream_insert<char,std::char_traits<char>>(poVar6,local_228,sVar7);
              }
            } while ((uVar11 == 0xffffffff) && (piVar4 = __errno_location(), *piVar4 == 4));
            if (uVar11 == 0) {
              GTestLog::GTestLog((GTestLog *)&local_98,GTEST_FATAL,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/vendor/googletest/googletest/src/gtest-death-test.cc"
                                 ,0x16f);
              Message::GetString_abi_cxx11_(&local_58,(Message *)&local_78);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cerr,local_58._M_dataplus._M_p,local_58._M_string_length);
            }
            else {
              piVar4 = __errno_location();
              iVar2 = *piVar4;
              GTestLog::GTestLog((GTestLog *)&local_98,GTEST_FATAL,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/vendor/googletest/googletest/src/gtest-death-test.cc"
                                 ,0x172);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cerr,"Error while reading death test internal: ",0x29);
              GetLastErrnoDescription_abi_cxx11_();
              poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                                 ((ostream *)&std::cerr,local_58._M_dataplus._M_p,
                                  local_58._M_string_length);
              std::__ostream_insert<char,std::char_traits<char>>(poVar6," [",2);
              poVar6 = (ostream *)std::ostream::operator<<((ostream *)poVar6,iVar2);
              std::__ostream_insert<char,std::char_traits<char>>(poVar6,"]",1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_58._M_dataplus._M_p != &local_58.field_2) {
              operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
            }
            GTestLog::~GTestLog((GTestLog *)&local_98);
            if (local_78._M_head_impl !=
                (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              (**(code **)(*(long *)local_78._M_head_impl + 8))();
            }
            goto LAB_0012e87e;
          }
          if (local_31[0] == 0x4c) {
            this->outcome_ = LIVED;
            goto LAB_0012e87e;
          }
        }
        else {
          if (local_31[0] == 0x54) {
            this->outcome_ = THREW;
            goto LAB_0012e87e;
          }
          if (local_31[0] == 0x52) {
            this->outcome_ = RETURNED;
            goto LAB_0012e87e;
          }
        }
        GTestLog::GTestLog((GTestLog *)local_228,GTEST_FATAL,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/vendor/googletest/googletest/src/gtest-death-test.cc"
                           ,499);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"Death test child process reported ",0x22);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"unexpected status byte (",0x18);
        poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
        GTestLog::~GTestLog((GTestLog *)local_228);
        goto LAB_0012e87e;
      }
      break;
    }
    piVar4 = __errno_location();
  } while (*piVar4 == 4);
  GTestLog::GTestLog((GTestLog *)&local_58,GTEST_FATAL,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/vendor/googletest/googletest/src/gtest-death-test.cc"
                     ,0x1f8);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,"Read from death test child process failed: ",0x2b);
  GetLastErrnoDescription_abi_cxx11_();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,(char *)local_228,buffer._0_8_);
  if (local_228 != (undefined1  [8])(buffer + 8)) {
    operator_delete((void *)local_228,buffer._8_8_ + 1);
  }
  GTestLog::~GTestLog((GTestLog *)&local_58);
LAB_0012e87e:
  do {
    while( true ) {
      iVar2 = close(this->read_fd_);
      if (iVar2 != -1) break;
      piVar4 = __errno_location();
      if (*piVar4 != 4) {
        local_100[0] = local_f0;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_100,"CHECK failed: File ","");
        plVar5 = (long *)std::__cxx11::string::append((char *)local_100);
        local_e0 = (long *)*plVar5;
        plVar8 = plVar5 + 2;
        if (local_e0 == plVar8) {
          local_d0 = *plVar8;
          lStack_c8 = plVar5[3];
          local_e0 = &local_d0;
        }
        else {
          local_d0 = *plVar8;
        }
        local_d8 = plVar5[1];
        *plVar5 = (long)plVar8;
        plVar5[1] = 0;
        *(undefined1 *)(plVar5 + 2) = 0;
        plVar5 = (long *)std::__cxx11::string::append((char *)&local_e0);
        local_c0._M_dataplus._M_p = (pointer)*plVar5;
        psVar9 = (size_type *)(plVar5 + 2);
        if ((size_type *)local_c0._M_dataplus._M_p == psVar9) {
          local_c0.field_2._M_allocated_capacity = *psVar9;
          local_c0.field_2._8_8_ = plVar5[3];
          local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
        }
        else {
          local_c0.field_2._M_allocated_capacity = *psVar9;
        }
        local_c0._M_string_length = plVar5[1];
        *plVar5 = (long)psVar9;
        plVar5[1] = 0;
        *(undefined1 *)(plVar5 + 2) = 0;
        local_9c = 0x1fb;
        StreamableToString<int>(&local_120,&local_9c);
        std::operator+(&local_98,&local_c0,&local_120);
        plVar5 = (long *)std::__cxx11::string::append((char *)&local_98);
        local_78._M_head_impl =
             (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)*plVar5;
        pbVar10 = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  (plVar5 + 2);
        if (local_78._M_head_impl == pbVar10) {
          local_68 = *(long *)pbVar10;
          lStack_60 = plVar5[3];
          local_78._M_head_impl =
               (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_68;
        }
        else {
          local_68 = *(long *)pbVar10;
        }
        error.ss_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl =
             *(unique_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&((__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                    *)(plVar5 + 1))->
                  super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ;
        *plVar5 = (long)pbVar10;
        plVar5[1] = 0;
        *(undefined1 *)(plVar5 + 2) = 0;
        plVar5 = (long *)std::__cxx11::string::append((char *)&local_78);
        local_58._M_dataplus._M_p = (pointer)*plVar5;
        psVar9 = (size_type *)(plVar5 + 2);
        if ((size_type *)local_58._M_dataplus._M_p == psVar9) {
          local_58.field_2._M_allocated_capacity = *psVar9;
          local_58.field_2._8_8_ = plVar5[3];
          local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
        }
        else {
          local_58.field_2._M_allocated_capacity = *psVar9;
        }
        local_58._M_string_length = plVar5[1];
        *plVar5 = (long)psVar9;
        plVar5[1] = 0;
        *(undefined1 *)(plVar5 + 2) = 0;
        plVar5 = (long *)std::__cxx11::string::append((char *)&local_58);
        local_228 = (undefined1  [8])*plVar5;
        plVar8 = plVar5 + 2;
        if (local_228 == (undefined1  [8])plVar8) {
          buffer._8_8_ = *plVar8;
          buffer._16_8_ = plVar5[3];
          local_228 = (undefined1  [8])(buffer + 8);
        }
        else {
          buffer._8_8_ = *plVar8;
        }
        buffer._0_8_ = plVar5[1];
        *plVar5 = (long)plVar8;
        plVar5[1] = 0;
        *(undefined1 *)(plVar5 + 2) = 0;
        DeathTestAbort((string *)local_228);
      }
    }
    bVar1 = AlwaysTrue();
  } while (!bVar1);
  this->read_fd_ = -1;
  return;
}

Assistant:

void DeathTestImpl::ReadAndInterpretStatusByte() {
  char flag;
  int bytes_read;

  // The read() here blocks until data is available (signifying the
  // failure of the death test) or until the pipe is closed (signifying
  // its success), so it's okay to call this in the parent before
  // the child process has exited.
  do {
    bytes_read = posix::Read(read_fd(), &flag, 1);
  } while (bytes_read == -1 && errno == EINTR);

  if (bytes_read == 0) {
    set_outcome(DIED);
  } else if (bytes_read == 1) {
    switch (flag) {
      case kDeathTestReturned:
        set_outcome(RETURNED);
        break;
      case kDeathTestThrew:
        set_outcome(THREW);
        break;
      case kDeathTestLived:
        set_outcome(LIVED);
        break;
      case kDeathTestInternalError:
        FailFromInternalError(read_fd());  // Does not return.
        break;
      default:
        GTEST_LOG_(FATAL) << "Death test child process reported "
                          << "unexpected status byte ("
                          << static_cast<unsigned int>(flag) << ")";
    }
  } else {
    GTEST_LOG_(FATAL) << "Read from death test child process failed: "
                      << GetLastErrnoDescription();
  }
  GTEST_DEATH_TEST_CHECK_SYSCALL_(posix::Close(read_fd()));
  set_read_fd(-1);
}